

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall
Catch::ConsoleReporter::assertionEnded(ConsoleReporter *this,AssertionStats *_assertionStats)

{
  bool bVar1;
  uint uVar2;
  IConfig *pIVar3;
  undefined1 local_c0 [8];
  AssertionPrinter printer;
  AssertionResult *result;
  AssertionStats *_assertionStats_local;
  ConsoleReporter *this_local;
  
  printer.messages.super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&_assertionStats->assertionResult;
  pIVar3 = Ptr<Catch::IConfig>::operator->(&(this->super_StreamingReporterBase).m_config);
  uVar2 = (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[7])();
  if (((uVar2 & 1) == 0) &&
     (bVar1 = AssertionResult::isOk
                        ((AssertionResult *)
                         printer.messages.
                         super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar1)) {
    this_local._7_1_ = false;
  }
  else {
    lazyPrint(this);
    AssertionPrinter::AssertionPrinter
              ((AssertionPrinter *)local_c0,(this->super_StreamingReporterBase).stream,
               _assertionStats);
    AssertionPrinter::print((AssertionPrinter *)local_c0);
    std::ostream::operator<<
              ((this->super_StreamingReporterBase).stream,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = true;
    AssertionPrinter::~AssertionPrinter((AssertionPrinter *)local_c0);
  }
  return this_local._7_1_;
}

Assistant:

virtual bool assertionEnded( AssertionStats const& _assertionStats ) {
            AssertionResult const& result = _assertionStats.assertionResult;

            // Drop out if result was successful and we're not printing those
            if( !m_config->includeSuccessfulResults() && result.isOk() )
                return false;

            lazyPrint();

            AssertionPrinter printer( stream, _assertionStats );
            printer.print();
            stream << std::endl;
            return true;
        }